

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Matrix.c
# Opt level: O3

void Llb_MtrVerifyRowsAll(Llb_Mtr_t *p)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  
  if (0 < (long)p->nCols) {
    lVar1 = 0;
    do {
      iVar2 = 0;
      if (0 < p->nRows) {
        uVar3 = 0;
        iVar2 = 0;
        do {
          iVar2 = iVar2 + (uint)(p->pMatrix[lVar1][uVar3] == '\x01');
          uVar3 = uVar3 + 1;
        } while ((uint)p->nRows != uVar3);
      }
      if (iVar2 != p->pColSums[lVar1]) {
        __assert_fail("Counter == p->pColSums[iCol]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Matrix.c"
                      ,0x4c,"void Llb_MtrVerifyRowsAll(Llb_Mtr_t *)");
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 != p->nCols);
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

//              0123              nCols
//             +--------------------->  
// pi        0 |  111             row0   pRowSums[0]  
// pi        1 | 1     11         row1   pRowSums[1] 
// pi        2 |   1  11          row2   pRowSums[2] 
// CS          |1       1
// CS          |1      111
// CS          |111    111
// int         |  11111           
// int         |     111          
// int         |       111        
// int         |         111      
// NS          |           11 11
// NS          |            11 1
// NS          |             111
//       nRows |
//             v    
//              cccc   pColSums[0]
//              oooo   pColSums[1]
//              llll   pColSums[2]
//              0123   pColSums[3]

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Verify columns.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Llb_MtrVerifyRowsAll( Llb_Mtr_t * p )
{
    int iRow, iCol, Counter;
    for ( iCol = 0; iCol < p->nCols; iCol++ )
    {
        Counter = 0;
        for ( iRow = 0; iRow < p->nRows; iRow++ )
            if ( p->pMatrix[iCol][iRow] == 1 )
                Counter++;
        assert( Counter == p->pColSums[iCol] );
    }
}